

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::msgpack::
basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::begin_object
          (basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
          ,item_event_visitor *visitor,uint8_t type,error_code *ec)

{
  int iVar1;
  parse_mode *__args;
  int iVar2;
  error_code *in_RCX;
  undefined1 in_DL;
  undefined8 in_RSI;
  uint8_t type_00;
  basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *in_RDI;
  size_t length;
  semantic_tag tag;
  undefined8 in_stack_ffffffffffffffd8;
  msgpack_errc __e;
  undefined7 in_stack_ffffffffffffffe8;
  basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this_00;
  
  type_00 = (uint8_t)((ulong)in_RSI >> 0x38);
  __e = (msgpack_errc)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  iVar2 = in_RDI->nesting_depth_ + 1;
  in_RDI->nesting_depth_ = iVar2;
  this_00 = in_RDI;
  iVar1 = msgpack_options_common::max_nesting_depth
                    ((msgpack_options_common *)
                     ((in_RDI->options_)._vptr_msgpack_decode_options[-3] +
                     (long)&(in_RDI->options_)._vptr_msgpack_decode_options));
  if (iVar1 < iVar2) {
    std::error_code::operator=(in_RCX,__e);
    in_RDI->more_ = false;
  }
  else {
    __args = (parse_mode *)
             get_size(this_00,type_00,(error_code *)CONCAT17(in_DL,in_stack_ffffffffffffffe8));
    if ((in_RDI->more_ & 1U) != 0) {
      tag = none;
      std::vector<jsoncons::msgpack::parse_state,std::allocator<jsoncons::msgpack::parse_state>>::
      emplace_back<jsoncons::msgpack::parse_mode,unsigned_long&>
                ((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                  *)in_RCX,__args,(unsigned_long *)CONCAT44(3,iVar2));
      basic_item_event_visitor<char>::begin_object
                ((basic_item_event_visitor<char> *)in_RCX,(size_t)__args,tag,
                 &in_RDI->super_ser_context,(error_code *)0x1b07cc);
      in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
    }
  }
  return;
}

Assistant:

void begin_object(item_event_visitor& visitor, uint8_t type, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = msgpack_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 
        std::size_t length = get_size(type, ec);
        if (!more_)
        {
            return;
        }
        state_stack_.emplace_back(parse_mode::map_key,length);
        visitor.begin_object(length, semantic_tag::none, *this, ec);
        more_ = !cursor_mode_;
    }